

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O2

wstring * __thiscall
ROM::Request::description_abi_cxx11_
          (wstring *__return_storage_ptr__,Request *this,int description_flags,wchar_t bullet_point)

{
  wstringstream output;
  _Any_data local_1d0;
  code *local_1c0;
  code *local_1b8;
  wstringstream local_1b0 [392];
  
  std::__cxx11::wstringstream::wstringstream(local_1b0);
  local_1b8 = std::
              _Function_handler<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:321:3)>
              ::_M_invoke;
  local_1c0 = std::
              _Function_handler<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Utility/ROMCatalogue.cpp:321:3)>
              ::_M_manager;
  local_1d0._M_unused._0_8_ = (undefined8)local_1b0;
  local_1d0._8_4_ = description_flags;
  local_1d0._12_4_ = bullet_point;
  visit(this,(function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
              *)&local_1d0);
  std::_Function_base::~_Function_base((_Function_base *)&local_1d0);
  std::__cxx11::wstringbuf::str();
  std::__cxx11::wstringstream::~wstringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::wstring Request::description(int description_flags, wchar_t bullet_point) {
	std::wstringstream output;

	visit(
		[&output, description_flags, bullet_point] (ROM::Request::LineItem item, ROM::Request::ListType type, int indentation_level, const ROM::Description *description, bool is_optional, size_t remaining) {
			if(indentation_level) {
				output << std::endl;
				for(int c = 0; c < indentation_level; c++) output << '\t';
				output << bullet_point << ' ';
			}

			switch(item) {
				case ROM::Request::LineItem::NewList:
					if(remaining > 1) {
						if(!indentation_level) output << " ";
						switch(type) {
							default:
							case ROM::Request::ListType::All:	output << "all of:";		break;
							case ROM::Request::ListType::Any:
								if(remaining == 2) {
									output << "either of:";
								} else {
									output << "any of:";
								}
							break;
						}
					} else {
						output << ":";
					}
				break;

				case ROM::Request::LineItem::Description: {
					if(is_optional) output << "optionally, ";

					const auto text = description->description(description_flags);
					std::wstring wide_text(text.size(), L' ');
					std::mbstowcs(wide_text.data(), text.data(), text.size());
					output << wide_text;

					if(remaining) {
						output << ";";
						if(remaining == 1) {
							output << ((type == ROM::Request::ListType::All) ? " and" : " or");
						}
					} else {
						output << ".";
					}
				} break;
			}
		}
	);

	return output.str();
}